

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

void P_SerializeSubsectors(FArchive *arc)

{
  FArchive *pFVar1;
  long lVar2;
  byte *pbVar3;
  int i_2;
  int iVar4;
  byte bVar5;
  long lVar6;
  int i;
  long lVar7;
  BYTE by;
  int num_subs;
  int num_nodes;
  int num_verts;
  
  if (arc->m_Storing == true) {
    if (hasglnodes) {
      pFVar1 = FArchive::operator<<(arc,(DWORD *)&numvertexes);
      pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&numsubsectors);
      FArchive::operator<<(pFVar1,(DWORD *)&numnodes);
      lVar6 = 0x2c;
      for (lVar7 = 0; lVar7 < numsubsectors; lVar7 = lVar7 + 8) {
        by = '\0';
        pbVar3 = (byte *)((long)&((subsector_t *)(subsectors->portalcoverage + -4))->sector + lVar6)
        ;
        bVar5 = 0;
        for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
          if (((int)lVar2 + (int)lVar7 < numsubsectors) && ((*pbVar3 & 2) != 0)) {
            bVar5 = bVar5 | (byte)(1 << ((byte)lVar2 & 0x1f));
            by = bVar5;
          }
          pbVar3 = pbVar3 + 0x60;
        }
        FArchive::operator<<(arc,&by);
        lVar6 = lVar6 + 0x300;
      }
    }
    else {
      num_verts = 0;
      pFVar1 = FArchive::operator<<(arc,(DWORD *)&num_verts);
      pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&num_verts);
      FArchive::operator<<(pFVar1,(DWORD *)&num_verts);
    }
  }
  else {
    pFVar1 = FArchive::operator<<(arc,(DWORD *)&num_verts);
    pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&num_subs);
    FArchive::operator<<(pFVar1,(DWORD *)&num_nodes);
    if (((num_verts == numvertexes) && (num_subs == numsubsectors)) && (num_nodes == numnodes)) {
      lVar6 = 0x2c;
      for (lVar7 = 0; lVar7 < num_subs; lVar7 = lVar7 + 8) {
        FArchive::operator<<(arc,&by);
        pbVar3 = (byte *)((long)&((subsector_t *)(subsectors->portalcoverage + -4))->sector + lVar6)
        ;
        for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
          if (((by >> ((uint)lVar2 & 0x1f) & 1) != 0) &&
             ((int)((uint)lVar2 + (int)lVar7) < numsubsectors)) {
            *pbVar3 = *pbVar3 | 2;
          }
          pbVar3 = pbVar3 + 0x60;
        }
        lVar6 = lVar6 + 0x300;
        num_subs = numsubsectors;
      }
    }
    else {
      for (iVar4 = 0; iVar4 < num_subs; iVar4 = iVar4 + 8) {
        FArchive::operator<<(arc,&by);
      }
      if (hasglnodes != false) {
        RecalculateDrawnSubsectors();
      }
    }
  }
  return;
}

Assistant:

void P_SerializeSubsectors(FArchive &arc)
{
	int num_verts, num_subs, num_nodes;	
	BYTE by;

	if (arc.IsStoring())
	{
		if (hasglnodes)
		{
			arc << numvertexes << numsubsectors << numnodes;	// These are only for verification
			for(int i=0;i<numsubsectors;i+=8)
			{
				by = 0;
				for(int j=0;j<8;j++)
				{
					if (i+j<numsubsectors && (subsectors[i+j].flags & SSECF_DRAWN))
					{
						by |= (1<<j);
					}
				}
				arc << by;
			}
		}
		else
		{
			int v = 0;
			arc << v << v << v;
		}
	}
	else
	{
		arc << num_verts << num_subs << num_nodes;
		if (num_verts != numvertexes ||
			num_subs != numsubsectors ||
			num_nodes != numnodes)
		{
			// Nodes don't match - we can't use this info
			for(int i=0;i<num_subs;i+=8)
			{
				// Skip the subsector info.
				arc << by;
			}
			if (hasglnodes)
			{
				RecalculateDrawnSubsectors();
			}
			return;
		}
		else
		{
			for(int i=0;i<numsubsectors;i+=8)
			{
				arc << by;
				for(int j=0;j<8;j++)
				{
					if ((by & (1<<j)) && i+j<numsubsectors)
					{
						subsectors[i+j].flags |= SSECF_DRAWN;
					}
				}
			}
		}
	}
}